

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O0

void __thiscall EventPlayer::EventPlayer(EventPlayer *this,EventPlayer *ep)

{
  Time *time;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  EventPlayer *local_18;
  EventPlayer *ep_local;
  EventPlayer *this_local;
  
  time = (ep->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         super_TimeDependent.xTime;
  local_18 = ep;
  ep_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Event Generator",&local_71);
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__EventPlayer_0018eea8;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__EventPlayer_0018ef40;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__EventPlayer_0018ef88;
  std::__cxx11::string::string((string *)&this->playerFileName);
  std::vector<double,_std::allocator<double>_>::vector(&this->playerBuffer);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->playerBuffer,&local_18->playerBuffer);
  this->playerBufferPosition = local_18->playerBufferPosition;
  this->playerCurrentValue = local_18->playerCurrentValue;
  this->playerNextValue = local_18->playerNextValue;
  return;
}

Assistant:

EventPlayer::EventPlayer( const EventPlayer &ep )
	: StochasticEventGenerator(ep.xTime)
{
	playerBuffer = ep.playerBuffer;
	playerBufferPosition = ep.playerBufferPosition;
	playerCurrentValue = ep.playerCurrentValue;
	playerNextValue = ep.playerNextValue;
}